

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O2

char * read_setting_s(settings_r *handle,char *key)

{
  void *pvVar1;
  char *pcVar2;
  skeyval tmp;
  char *local_18 [2];
  
  local_18[0] = key;
  if ((handle == (settings_r *)0x0) ||
     (pvVar1 = find234(handle->t,local_18,(cmpfn234)0x0), pvVar1 == (void *)0x0)) {
    pcVar2 = get_setting(key);
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    pcVar2 = *(char **)((long)pvVar1 + 8);
    if (pcVar2 == (char *)0x0) {
      __assert_fail("val != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/storage.c"
                    ,0x1aa,"char *read_setting_s(settings_r *, const char *)");
    }
  }
  pcVar2 = dupstr(pcVar2);
  return pcVar2;
}

Assistant:

char *read_setting_s(settings_r *handle, const char *key)
{
    const char *val;
    struct skeyval tmp, *kv;

    tmp.key = key;
    if (handle != NULL &&
        (kv = find234(handle->t, &tmp, NULL)) != NULL) {
        val = kv->value;
        assert(val != NULL);
    } else
        val = get_setting(key);

    if (!val)
        return NULL;
    else
        return dupstr(val);
}